

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O1

void __thiscall
ORPG::Character::Character
          (Character *this,Race *racePtr,AbilityScores *ab,CharacterClass *classPtr,int bgID,
          Skills *sk,string *name)

{
  Background *pBVar1;
  NameGenerator ng;
  long *local_110 [2];
  long local_100 [2];
  long *local_f0 [2];
  long local_e0 [2];
  long *local_d0 [2];
  long local_c0 [2];
  NameGenerator local_b0 [128];
  
  this->race = racePtr;
  this->abils = ab;
  this->cClass = classPtr;
  this->skills = sk;
  (this->firstName)._M_dataplus._M_p = (pointer)&(this->firstName).field_2;
  (this->firstName)._M_string_length = 0;
  (this->firstName).field_2._M_local_buf[0] = '\0';
  (this->lastName)._M_dataplus._M_p = (pointer)&(this->lastName).field_2;
  (this->lastName)._M_string_length = 0;
  (this->lastName).field_2._M_local_buf[0] = '\0';
  (this->langs).super__Vector_base<ORPG::Language,_std::allocator<ORPG::Language>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->langs).super__Vector_base<ORPG::Language,_std::allocator<ORPG::Language>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->langs).super__Vector_base<ORPG::Language,_std::allocator<ORPG::Language>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pBVar1 = background_selector(bgID);
  this->bg = pBVar1;
  if (name->_M_string_length == 0) {
    (*this->race->_vptr_Race[3])(local_d0);
    local_f0[0] = local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"");
    ORPG::NameGenerator::NameGenerator(local_b0,local_d0,local_f0);
    if (local_f0[0] != local_e0) {
      operator_delete(local_f0[0],local_e0[0] + 1);
    }
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
    ORPG::NameGenerator::make_first_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&this->firstName,(string *)local_110);
    if (local_110[0] != local_100) {
      operator_delete(local_110[0],local_100[0] + 1);
    }
    ORPG::NameGenerator::make_last_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&this->lastName,(string *)local_110);
    if (local_110[0] != local_100) {
      operator_delete(local_110[0],local_100[0] + 1);
    }
    NameGenerator::~NameGenerator(local_b0);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&this->firstName);
    std::__cxx11::string::_M_assign((string *)&this->lastName);
  }
  Initialize(this);
  return;
}

Assistant:

Character::Character(Race* racePtr, AbilityScores* ab, CharacterClass* classPtr,
                        const int bgID, Skills* sk, std::string name):
                        race(racePtr), abils(ab), cClass(classPtr), skills(sk) {
        bg = background_selector(bgID);

        if(name.empty()) {
            NameGenerator ng(race->to_string());

            firstName = ng.make_first();
            lastName = ng.make_last();
        } else {
            /* TODO make this work by parsing the name into a first and last */
            firstName = name;
            lastName = name;
        }

        Initialize();
    }